

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_zip_ZipReader.cpp
# Opt level: O2

bool __thiscall
axl::zip::ZipReader::extractFileToFile(ZipReader *this,size_t index,StringRef *fileName)

{
  mz_zip_archive *pZip;
  mz_bool mVar1;
  C *pDst_filename;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> BStack_28;
  
  pZip = this->m_zip;
  pDst_filename = sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::sz(fileName);
  mVar1 = mz_zip_reader_extract_to_file(pZip,(mz_uint)index,pDst_filename,0);
  if (mVar1 == 0) {
    err::ErrorRef::ErrorRef((ErrorRef *)&BStack_28,5);
    err::setError((ErrorRef *)&BStack_28);
    rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::~BufRef(&BStack_28);
  }
  return mVar1 != 0;
}

Assistant:

bool
ZipReader::extractFileToFile(
	size_t index,
	const sl::StringRef& fileName
) const {
	ASSERT(isOpen());

	mz_bool result = mz_zip_reader_extract_to_file(
		m_zip,
		index,
		fileName.sz(),
		0
	);

	return result ? true : err::fail(err::SystemErrorCode_Unsuccessful);
}